

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseTemplateTemplateParam(State *state)

{
  bool bVar1;
  bool local_36;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    bVar1 = ParseTemplateParam(guard.state_);
    local_36 = true;
    if (!bVar1) {
      local_36 = ParseSubstitution(guard.state_,false);
    }
    state_local._7_1_ = local_36;
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseTemplateTemplateParam(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  return (ParseTemplateParam(state) ||
          // "std" on its own isn't a template.
          ParseSubstitution(state, /*accept_std=*/false));
}